

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFilterContains.cpp
# Opt level: O2

bool __thiscall
liblogger::LogFilterContains::Filter(LogFilterContains *this,LogType Type,string *str)

{
  int iVar1;
  long lVar2;
  
  if (this->m_case == false) {
    iVar1 = strcasecmp((this->m_match)._M_dataplus._M_p,(str->_M_dataplus)._M_p);
    if (iVar1 == 0) {
      return true;
    }
  }
  else {
    lVar2 = std::__cxx11::string::find((string *)str,(ulong)&this->m_match);
    if (lVar2 != -1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool LogFilterContains::Filter(const LogType Type, const std::string &str)
{
	if (m_case == false)
	{
		if (strcasecmp(m_match.c_str(), str.c_str()) == 0)
		{
			return true;
		}
	}
	else
	{
		if (str.find(m_match) != std::string::npos)
		{
			return true;
		}
	}

	return false;
}